

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

void LDSketch_get_heavy_keys(LDSketch_t *sk,longlong thresh,uchar *keys,longlong *vals,int *num_key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *keys_00;
  longlong lVar7;
  int iVar8;
  size_t nmemb;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int tmp_n;
  long *local_50 [2];
  long local_40 [2];
  
  nmemb = 0;
  if (0 < sk->h * sk->w) {
    lVar11 = 0;
    do {
      if ((thresh <= sk->tbl[lVar11]->max_value) &&
         (uVar2 = dyn_tbl_length(sk->tbl[lVar11]), (int)nmemb < (int)uVar2)) {
        nmemb = (size_t)uVar2;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)sk->h * (long)sk->w);
  }
  iVar10 = sk->lgn;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tmp heavy keys","");
  iVar9 = iVar10 + 7;
  if (-1 < iVar10) {
    iVar9 = iVar10;
  }
  keys_00 = (uchar *)safe_calloc(nmemb,(long)(iVar9 >> 3),(char *)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (sk->h * sk->w < 1) {
    iVar10 = 0;
  }
  else {
    lVar11 = 0;
    iVar10 = 0;
    do {
      if (thresh <= sk->tbl[lVar11]->max_value) {
        dyn_tbl_get_heavy_key(sk->tbl[lVar11],thresh,keys_00,(int *)local_50);
        if (0 < (int)local_50[0]) {
          iVar9 = 0;
          do {
            bVar1 = 0 < iVar10;
            if (iVar10 < 1) {
LAB_00104ee4:
              iVar6 = sk->lgn * iVar9;
              iVar8 = iVar6 + 7;
              if (-1 < iVar6) {
                iVar8 = iVar6;
              }
              lVar7 = LDSketch_up_estimate(sk,keys_00 + (iVar8 >> 3));
              if (thresh <= lVar7) {
                iVar8 = sk->lgn;
                iVar3 = iVar8 * iVar10;
                iVar6 = iVar3 + 7;
                if (-1 < iVar3) {
                  iVar6 = iVar3;
                }
                iVar4 = iVar8 * iVar9;
                iVar3 = iVar4 + 7;
                if (-1 < iVar4) {
                  iVar3 = iVar4;
                }
                iVar4 = iVar8 + 7;
                if (-1 < iVar8) {
                  iVar4 = iVar8;
                }
                memcpy(keys + (iVar6 >> 3),keys_00 + (iVar3 >> 3),(long)(iVar4 >> 3));
                vals[iVar10] = lVar7;
                iVar10 = iVar10 + 1;
              }
            }
            else {
              iVar8 = sk->lgn;
              iVar3 = iVar8 * iVar9;
              iVar6 = iVar3 + 7;
              if (-1 < iVar3) {
                iVar6 = iVar3;
              }
              iVar3 = iVar8 + 7;
              if (-1 < iVar8) {
                iVar3 = iVar8;
              }
              iVar4 = bcmp(keys_00 + (iVar6 >> 3),keys,(long)(iVar3 >> 3));
              if (iVar4 != 0) {
                iVar12 = 0;
                iVar4 = iVar8;
                do {
                  if (iVar10 + iVar12 == 1) {
                    bVar1 = false;
                    goto LAB_00104ee4;
                  }
                  iVar5 = iVar4 + 7;
                  if (-1 < iVar4) {
                    iVar5 = iVar4;
                  }
                  iVar5 = bcmp(keys_00 + (iVar6 >> 3),keys + (iVar5 >> 3),(long)(iVar3 >> 3));
                  iVar12 = iVar12 + -1;
                  iVar4 = iVar4 + iVar8;
                } while (iVar5 != 0);
                bVar1 = -iVar12 < iVar10;
              }
            }
            if (bVar1) break;
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_50[0]);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)sk->h * (long)sk->w);
  }
  *num_key = iVar10;
  return;
}

Assistant:

void LDSketch_get_heavy_keys(LDSketch_t* sk, long long thresh,
	unsigned char* keys, long long* vals,
	int* num_key) {
	int max_array_len = 0;
	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			int len = dyn_tbl_length(sk->tbl[i]);
			if (len > max_array_len) {
				max_array_len = len;
			}
		}
	}

	unsigned char* tmp_keys = (unsigned char*)safe_calloc(
		max_array_len, sk->lgn / 8, std::string("tmp heavy keys").c_str());
	int tmp_n, n = 0;

	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			dyn_tbl_get_heavy_key(sk->tbl[i], thresh, tmp_keys, &tmp_n);
			for (int j = 0; j < tmp_n; j++) {
				// deduplicate
				int k = 0;
				for (; k < n; k++) {
					if (memcmp(tmp_keys + j * sk->lgn / 8, keys + k * sk->lgn / 8,
						sk->lgn / 8) == 0) {
						break;
					}
				}
				if (k < n) {
					break;
				}

				long long v = LDSketch_up_estimate(sk, tmp_keys + j * sk->lgn / 8);
				if (v >= thresh) {
					memcpy(keys + n * sk->lgn / 8, tmp_keys + j * sk->lgn / 8,
						sk->lgn / 8);
					vals[n] = v;
					n++;
				}
			}
		}
	}

	*num_key = n;
}